

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conductor.hpp
# Opt level: O2

void __thiscall ConductorBRDF::ConductorBRDF(ConductorBRDF *this,string *name)

{
  undefined8 uVar1;
  __type _Var2;
  undefined8 *puVar3;
  bool bVar4;
  long lVar5;
  
  (this->super_BRDF)._vptr_BRDF = (_func_int **)0x160a70;
  *(undefined8 *)&this->field_0x28 = 0x160ab8;
  *(undefined8 *)&(this->super_BRDF).field_0x8 = 0x160a90;
  *(undefined8 *)&(this->super_BRDF).field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  (this->k).y = 0.0;
  (this->k).z = 0.0;
  *(undefined4 *)&this->field_0x30 = 3;
  bVar4 = false;
  for (lVar5 = 0; lVar5 != 0x8c0; lVar5 = lVar5 + 0x38) {
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&complexIorList[0].name._M_dataplus._M_p + lVar5),name);
    if (_Var2) {
      *(undefined4 *)&this->field_0x18 = *(undefined4 *)((long)&complexIorList[0].eta.z + lVar5);
      *(undefined8 *)&(this->super_BRDF).field_0x10 =
           *(undefined8 *)((long)&complexIorList[0].eta.x + lVar5);
      (this->k).z = *(float *)((long)&complexIorList[0].k.z + lVar5);
      uVar1 = *(undefined8 *)((long)&complexIorList[0].k.x + lVar5);
      (this->k).x = (float)(int)uVar1;
      (this->k).y = (float)(int)((ulong)uVar1 >> 0x20);
      bVar4 = true;
    }
  }
  if (bVar4) {
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "conductor material not found";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

ConductorBRDF(std::string name)
	{
		flags = Type(DIRAC | REFLECT);
		bool found = false;
		for (int i=0; i<ComplexIorCount; ++i)
			if (complexIorList[i].name == name) {
				found = true;
				eta = complexIorList[i].eta;
				k = complexIorList[i].k;
			}
		if (!found) throw "conductor material not found";
	}